

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O1

void cloudClearMark(CloudManager *dd,CloudNode *n)

{
  uint uVar1;
  
  for (; (((uint)dd->bitsNode >> 0x1c & 1) != 0 &&
         (uVar1 = dd->bitsNode & 0xefffffff, dd->bitsNode = uVar1, uVar1 != 0xfffffff));
      dd = (CloudManager *)(*(ulong *)dd->bitsCache & 0xfffffffffffffffe)) {
    cloudClearMark(*(CloudManager **)(dd->bitsCache + 2),n);
  }
  return;
}

Assistant:

static void cloudClearMark( CloudManager * dd, CloudNode * n )
{
    if ( !cloudNodeIsMarked(n) )
        return;
    // clear visited flag
    cloudNodeUnmark(n);
    if ( cloudIsConstant(n) )
        return;
    cloudClearMark( dd, cloudT(n) );
    cloudClearMark( dd, Cloud_Regular(cloudE(n)) );
}